

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int renameEditSql(sqlite3_context *pCtx,RenameCtx *pRename,char *zSql,char *zNew,int bQuote)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  ulong __n;
  sqlite3 *db_00;
  sqlite3 *in_RCX;
  void *in_RDX;
  RenameCtx *in_RSI;
  sqlite3_context *in_RDI;
  int in_R8D;
  char *pcVar5;
  undefined8 in_R9;
  RenameToken *pBest;
  char *zReplace;
  u32 nReplace;
  int iOff;
  int nOut;
  char *zBuf2;
  char *zBuf1;
  i64 nQuot;
  char *zOut;
  char *zQuot;
  int rc;
  sqlite3 *db;
  i64 nSql;
  i64 nNew;
  RenameToken *in_stack_ffffffffffffff68;
  sqlite3 *in_stack_ffffffffffffff70;
  undefined1 *puVar6;
  undefined4 in_stack_ffffffffffffff78;
  uint in_stack_ffffffffffffff7c;
  int in_stack_ffffffffffffff80;
  sqlite3 *local_78;
  char *local_70;
  void *local_60;
  sqlite3 *local_58;
  int local_4c;
  
  uVar1 = sqlite3Strlen30((char *)in_stack_ffffffffffffff68);
  iVar2 = sqlite3Strlen30((char *)in_stack_ffffffffffffff68);
  __n = (ulong)iVar2;
  db_00 = sqlite3_context_db_handle(in_RDI);
  local_4c = 0;
  local_58 = (sqlite3 *)0x0;
  uVar4 = 0;
  local_70 = (char *)0x0;
  local_78 = (sqlite3 *)0x0;
  if (in_RCX == (sqlite3 *)0x0) {
    local_60 = sqlite3DbMallocZero(in_stack_ffffffffffffff70,(u64)in_stack_ffffffffffffff68);
    if (local_60 != (void *)0x0) {
      local_70 = (char *)((long)local_60 + __n * 2 + 1);
      local_78 = (sqlite3 *)((long)local_60 + __n * 4 + 2);
    }
  }
  else {
    local_58 = (sqlite3 *)sqlite3MPrintf(db_00,"\"%w\" ",in_RCX);
    if (local_58 == (sqlite3 *)0x0) {
      return 7;
    }
    iVar3 = sqlite3Strlen30((char *)in_stack_ffffffffffffff68);
    uVar4 = iVar3 - 1;
    local_60 = sqlite3DbMallocZero(in_stack_ffffffffffffff70,(u64)in_stack_ffffffffffffff68);
  }
  if (local_60 == (void *)0x0) {
    local_4c = 7;
  }
  else {
    memcpy(local_60,in_RDX,__n);
    while (in_RSI->pList != (RenameToken *)0x0) {
      puVar6 = &DAT_aaaaaaaaaaaaaaaa;
      in_stack_ffffffffffffff68 = renameColumnTokenNext(in_RSI);
      if (in_RCX == (sqlite3 *)0x0) {
        memcpy(local_70,(in_stack_ffffffffffffff68->t).z,(ulong)(in_stack_ffffffffffffff68->t).n);
        local_70[(in_stack_ffffffffffffff68->t).n] = '\0';
        sqlite3Dequote(local_70);
        pcVar5 = "";
        if ((in_stack_ffffffffffffff68->t).z[(in_stack_ffffffffffffff68->t).n] == '\'') {
          pcVar5 = " ";
        }
        sqlite3_snprintf((int)((__n & 0x7fffffff) << 1),(char *)local_78,"%Q%s",local_70,pcVar5,
                         in_R9,in_stack_ffffffffffffff68,puVar6);
        in_stack_ffffffffffffff70 = local_78;
        in_stack_ffffffffffffff7c = sqlite3Strlen30((char *)in_stack_ffffffffffffff68);
      }
      else if (((in_R8D != 0) ||
               (iVar3 = sqlite3IsIdChar(*(in_stack_ffffffffffffff68->t).z),
               in_stack_ffffffffffffff70 = in_RCX, in_stack_ffffffffffffff7c = uVar1, iVar3 == 0))
              && (in_stack_ffffffffffffff70 = local_58, in_stack_ffffffffffffff7c = uVar4,
                 (in_stack_ffffffffffffff68->t).z[(in_stack_ffffffffffffff68->t).n] == '\"')) {
        in_stack_ffffffffffffff7c = uVar4 + 1;
      }
      in_stack_ffffffffffffff80 = (int)(in_stack_ffffffffffffff68->t).z - (int)in_RDX;
      if ((in_stack_ffffffffffffff68->t).n != in_stack_ffffffffffffff7c) {
        memmove((void *)((long)local_60 +
                        (ulong)(in_stack_ffffffffffffff80 + in_stack_ffffffffffffff7c)),
                (void *)((long)local_60 +
                        (ulong)(in_stack_ffffffffffffff80 + (in_stack_ffffffffffffff68->t).n)),
                (ulong)(iVar2 - (in_stack_ffffffffffffff80 + (in_stack_ffffffffffffff68->t).n)));
        iVar2 = (in_stack_ffffffffffffff7c - (in_stack_ffffffffffffff68->t).n) + iVar2;
        *(undefined1 *)((long)local_60 + (long)iVar2) = 0;
      }
      memcpy((void *)((long)local_60 + (long)in_stack_ffffffffffffff80),in_stack_ffffffffffffff70,
             (ulong)in_stack_ffffffffffffff7c);
      sqlite3DbFree(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    }
    sqlite3_result_text((sqlite3_context *)CONCAT44(iVar2,in_stack_ffffffffffffff80),
                        (char *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                        (int)((ulong)in_stack_ffffffffffffff70 >> 0x20),
                        (_func_void_void_ptr *)in_stack_ffffffffffffff68);
    sqlite3DbFree(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  }
  sqlite3_free((void *)0x229fbd);
  return local_4c;
}

Assistant:

static int renameEditSql(
  sqlite3_context *pCtx,          /* Return result here */
  RenameCtx *pRename,             /* Rename context */
  const char *zSql,               /* SQL statement to edit */
  const char *zNew,               /* New token text */
  int bQuote                      /* True to always quote token */
){
  i64 nNew = sqlite3Strlen30(zNew);
  i64 nSql = sqlite3Strlen30(zSql);
  sqlite3 *db = sqlite3_context_db_handle(pCtx);
  int rc = SQLITE_OK;
  char *zQuot = 0;
  char *zOut;
  i64 nQuot = 0;
  char *zBuf1 = 0;
  char *zBuf2 = 0;

  if( zNew ){
    /* Set zQuot to point to a buffer containing a quoted copy of the
    ** identifier zNew. If the corresponding identifier in the original
    ** ALTER TABLE statement was quoted (bQuote==1), then set zNew to
    ** point to zQuot so that all substitutions are made using the
    ** quoted version of the new column name.  */
    zQuot = sqlite3MPrintf(db, "\"%w\" ", zNew);
    if( zQuot==0 ){
      return SQLITE_NOMEM;
    }else{
      nQuot = sqlite3Strlen30(zQuot)-1;
    }

    assert( nQuot>=nNew );
    zOut = sqlite3DbMallocZero(db, nSql + pRename->nList*nQuot + 1);
  }else{
    zOut = (char*)sqlite3DbMallocZero(db, (nSql*2+1) * 3);
    if( zOut ){
      zBuf1 = &zOut[nSql*2+1];
      zBuf2 = &zOut[nSql*4+2];
    }
  }

  /* At this point pRename->pList contains a list of RenameToken objects
  ** corresponding to all tokens in the input SQL that must be replaced
  ** with the new column name, or with single-quoted versions of themselves.
  ** All that remains is to construct and return the edited SQL string. */
  if( zOut ){
    int nOut = nSql;
    memcpy(zOut, zSql, nSql);
    while( pRename->pList ){
      int iOff;                   /* Offset of token to replace in zOut */
      u32 nReplace;
      const char *zReplace;
      RenameToken *pBest = renameColumnTokenNext(pRename);

      if( zNew ){
        if( bQuote==0 && sqlite3IsIdChar(*pBest->t.z) ){
          nReplace = nNew;
          zReplace = zNew;
        }else{
          nReplace = nQuot;
          zReplace = zQuot;
          if( pBest->t.z[pBest->t.n]=='"' ) nReplace++;
        }
      }else{
        /* Dequote the double-quoted token. Then requote it again, this time
        ** using single quotes. If the character immediately following the
        ** original token within the input SQL was a single quote ('), then
        ** add another space after the new, single-quoted version of the
        ** token. This is so that (SELECT "string"'alias') maps to
        ** (SELECT 'string' 'alias'), and not (SELECT 'string''alias').  */
        memcpy(zBuf1, pBest->t.z, pBest->t.n);
        zBuf1[pBest->t.n] = 0;
        sqlite3Dequote(zBuf1);
        sqlite3_snprintf(nSql*2, zBuf2, "%Q%s", zBuf1,
            pBest->t.z[pBest->t.n]=='\'' ? " " : ""
        );
        zReplace = zBuf2;
        nReplace = sqlite3Strlen30(zReplace);
      }

      iOff = pBest->t.z - zSql;
      if( pBest->t.n!=nReplace ){
        memmove(&zOut[iOff + nReplace], &zOut[iOff + pBest->t.n],
            nOut - (iOff + pBest->t.n)
        );
        nOut += nReplace - pBest->t.n;
        zOut[nOut] = '\0';
      }
      memcpy(&zOut[iOff], zReplace, nReplace);
      sqlite3DbFree(db, pBest);
    }

    sqlite3_result_text(pCtx, zOut, -1, SQLITE_TRANSIENT);
    sqlite3DbFree(db, zOut);
  }else{
    rc = SQLITE_NOMEM;
  }

  sqlite3_free(zQuot);
  return rc;
}